

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O2

LabelId __thiscall
optimization::global_expr_move::Global_Expr_Mov::bfs
          (Global_Expr_Mov *this,int start,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  _Rb_tree_header *p_Var1;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  *__rhs;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  size_type sVar6;
  _Base_ptr p_Var7;
  _Rb_tree_color _Var8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *unaff_RBP;
  int x;
  LabelId p;
  int p_2;
  set<int,_std::less<int>,_std::allocator<int>_> res;
  set<int,_std::less<int>,_std::allocator<int>_> prec;
  int p_1;
  _Rb_tree_color local_27c;
  Global_Expr_Mov *local_278;
  _Rb_tree_color local_26c;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  *local_268;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_260;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_230;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_200;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1a0;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_170;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_120;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_d0;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_80;
  
  local_27c = start;
  local_278 = this;
  pmVar3 = std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 *)(*env + 0x68),(key_type *)&local_27c);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_1d0,&(pmVar3->preceding)._M_t);
  _Var8 = local_27c;
  if (local_1d0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_200._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_200._M_impl.super__Rb_tree_header._M_header;
    local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_268 = op;
    local_200._M_impl.super__Rb_tree_header._M_header._M_right =
         local_200._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_1d0._M_impl.super__Rb_tree_header._M_node_count == 1) {
      _Var8 = local_1d0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      std::__detail::__variant::
      _Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                         *)&local_120,
                        (_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                         *)op);
      local_260._M_impl._0_4_ = bfs(local_278,_Var8,&local_120);
      pmVar4 = std::
               map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
               ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                     *)(env + 2),(key_type *)&local_260);
      std::__detail::__variant::
      _Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                         *)&local_170,
                        (_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                         *)op);
      bVar2 = BlockOps::has_op(pmVar4,&local_170);
      if (bVar2) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_200,(int *)&local_260);
      }
    }
    else {
      get_precedings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_260,local_278,
                     local_1d0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
                (&local_200,&local_260);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_260);
      if ((op->
          super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          ).
          super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          ._M_index != '\0') {
        local_260._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_260._M_impl.super__Rb_tree_header._M_header;
        local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_260._M_impl.super__Rb_tree_header._M_header._M_right =
             local_260._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var5 = local_200._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &local_200._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          local_1a0._M_impl._0_4_ = p_Var5[1]._M_color;
          pmVar4 = std::
                   map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                   ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                         *)(env + 2),(key_type *)&local_1a0);
          std::__detail::__variant::
          _Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                             *)&local_80,
                            (_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                             *)local_268);
          bVar2 = BlockOps::disable_op(pmVar4,&local_80);
          if ((bVar2) &&
             (sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_260,
                                 (key_type *)&local_1a0), sVar6 == 0)) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_260,(int *)&local_1a0);
            get_precedings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_230,local_278,
                           local_1a0._M_impl._0_4_);
            for (p_Var7 = local_230._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var7 != &local_230._M_impl.super__Rb_tree_header;
                p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
              local_26c = p_Var7[1]._M_color;
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_260,(int *)&local_26c);
            }
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_230);
          }
        }
        for (p_Var5 = local_260._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &local_260._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          local_230._M_impl._0_4_ = p_Var5[1]._M_color;
          sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_200,
                             (key_type *)&local_230);
          if (sVar6 != 0) {
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            erase(&local_200,(key_type *)&local_230);
          }
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_260);
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_1d0,
                       (const_iterator)local_1d0._M_impl.super__Rb_tree_header._M_header._M_left);
      p_Var1 = &local_230._M_impl.super__Rb_tree_header;
      unaff_RBP = &local_230;
      for (; (_Rb_tree_header *)local_1d0._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_1d0._M_impl.super__Rb_tree_header;
          local_1d0._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               std::_Rb_tree_increment(local_1d0._M_impl.super__Rb_tree_header._M_header._M_left)) {
        get_precedings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_260,local_278,
                       local_1d0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color);
        local_230._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_230._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_230._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_230._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        std::
        __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_200._M_impl.super__Rb_tree_header._M_header._M_left,
                   &local_200._M_impl.super__Rb_tree_header,
                   local_260._M_impl.super__Rb_tree_header._M_header._M_left,
                   &local_260._M_impl.super__Rb_tree_header,unaff_RBP,p_Var1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  (&local_1a0,unaff_RBP);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&local_200,&local_1a0);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_1a0);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(unaff_RBP);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_260);
      }
    }
    __rhs = local_268;
    for (p_Var5 = local_200._M_impl.super__Rb_tree_header._M_header._M_left;
        _Var8 = (_Rb_tree_color)unaff_RBP,
        (_Rb_tree_header *)p_Var5 != &local_200._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      local_260._M_impl._0_4_ = p_Var5[1]._M_color;
      pmVar4 = std::
               map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
               ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                     *)(env + 2),(key_type *)&local_260);
      std::__detail::__variant::
      _Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                         *)&local_d0,
                        (_Copy_ctor_base<false,_optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                         *)__rhs);
      bVar2 = BlockOps::has_op(pmVar4,&local_d0);
      _Var8 = local_260._M_impl._0_4_;
      if (bVar2) break;
    }
    if ((_Rb_tree_header *)p_Var5 == &local_200._M_impl.super__Rb_tree_header) {
      _Var8 = local_27c;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_200);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1d0);
  return _Var8;
}

Assistant:

mir::types::LabelId bfs(int start, std::variant<Op, LoadOp> op) {
    auto prec = env->func.basic_blks.at(start).preceding;
    if (prec.size() == 0) {
      return start;
    }
    std::set<mir::types::LabelId> res;
    if (prec.size() == 1) {
      auto p = bfs(*prec.begin(), op);
      if (env->blk_op_map.at(p).has_op(op)) {
        res.insert(p);
      }
    } else {
      auto f = *prec.begin();
      res = get_precedings(f);
      if (op.index() != 0) {
        std::set<mir::types::LabelId> disabled_pre;
        for (auto p : res) {
          if (env->blk_op_map.at(p).disable_op(op)) {
            if (disabled_pre.count(p)) {
              continue;
            }
            disabled_pre.insert(p);
            for (auto x : get_precedings(p)) {
              disabled_pre.insert(x);
            }
          }
        }
        for (auto p : disabled_pre) {
          if (res.count(p)) {
            res.erase(p);
          }
        }
      }

      prec.erase(prec.begin());
      for (auto p : prec) {
        auto precs = get_precedings(p);
        std::set<int> tmp;
        std::set_intersection(res.begin(), res.end(), precs.begin(),
                              precs.end(), std::inserter(tmp, tmp.begin()));
        res = std::set(tmp);
      }
    }

    for (auto p : res) {
      if (env->blk_op_map.at(p).has_op(op)) {
        return p;
      }
    }
    return start;
  }